

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.c
# Opt level: O2

apx_error_t
apx_fileManager_send_local_const_data
          (apx_fileManager_t *self,uint32_t address,uint8_t *data,apx_size_t size)

{
  _Bool _Var1;
  apx_error_t aVar2;
  apx_file_t *self_00;
  
  if (data == (uint8_t *)0x0 || self == (apx_fileManager_t *)0x0) {
    aVar2 = 1;
  }
  else {
    self_00 = apx_fileManagerShared_find_file_by_address(&self->shared,address);
    if (self_00 == (apx_file_t *)0x0) {
      aVar2 = 0x31;
    }
    else {
      _Var1 = apx_file_is_open(self_00);
      if (_Var1) {
        aVar2 = apx_fileManagerWorker_prepare_send_local_const_data(&self->worker,address,data,size)
        ;
        return aVar2;
      }
      aVar2 = 0x39;
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_fileManager_send_local_const_data(apx_fileManager_t* self, uint32_t address, uint8_t const* data, apx_size_t size)
{
   if (self != NULL && data != NULL)
   {
      apx_file_t* file = apx_fileManagerShared_find_file_by_address(&self->shared, address);
      if (file == NULL)
      {
         return APX_FILE_NOT_FOUND_ERROR;
      }
      if (!apx_file_is_open(file))
      {
         return APX_FILE_NOT_OPEN_ERROR;
      }
      return apx_fileManagerWorker_prepare_send_local_const_data(&self->worker, address, data, (uint32_t)size);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}